

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# movDemuxer.h
# Opt level: O0

int64_t __thiscall MovDemuxer::getTrackDelay(MovDemuxer *this,int32_t pid)

{
  bool bVar1;
  mapped_type *pmVar2;
  mapped_type local_38;
  _Self local_28;
  _Self local_20;
  int32_t local_14;
  MovDemuxer *pMStack_10;
  int32_t pid_local;
  MovDemuxer *this_local;
  
  local_14 = pid;
  pMStack_10 = this;
  local_20._M_node =
       (_Base_ptr)
       std::map<int,_long,_std::less<int>,_std::allocator<std::pair<const_int,_long>_>_>::find
                 (&this->m_firstTimecode,&local_14);
  local_28._M_node =
       (_Base_ptr)
       std::map<int,_long,_std::less<int>,_std::allocator<std::pair<const_int,_long>_>_>::end
                 (&this->m_firstTimecode);
  bVar1 = std::operator!=(&local_20,&local_28);
  if (bVar1) {
    pmVar2 = std::map<int,_long,_std::less<int>,_std::allocator<std::pair<const_int,_long>_>_>::
             operator[](&this->m_firstTimecode,&local_14);
    local_38 = *pmVar2;
  }
  else {
    local_38 = 0;
  }
  return local_38;
}

Assistant:

int64_t getTrackDelay(const int32_t pid) override
    {
        return (m_firstTimecode.find(pid) != m_firstTimecode.end()) ? m_firstTimecode[pid] : 0;
    }